

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::javanano::EnumGenerator::~EnumGenerator(EnumGenerator *this)

{
  std::
  _Vector_base<google::protobuf::compiler::javanano::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::javanano::EnumGenerator::Alias>_>
  ::~_Vector_base(&(this->aliases_).
                   super__Vector_base<google::protobuf::compiler::javanano::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::javanano::EnumGenerator::Alias>_>
                 );
  std::
  _Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ::~_Vector_base(&(this->canonical_values_).
                   super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                 );
  return;
}

Assistant:

EnumGenerator::~EnumGenerator() {}